

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O3

void SstStreamDestroy(SstStream Stream)

{
  pthread_mutex_t *__mutex;
  _TimestepMetadataList *p_Var1;
  StepRequest __ptr;
  FFSFormatList __ptr_00;
  FFSFormatBlock *pFVar2;
  long lVar3;
  _TimestepMetadataList *__ptr_01;
  CP_GlobalCMInfo __ptr_02;
  WS_ReaderInfo p_Var4;
  SstParams p_Var5;
  WS_ReaderInfo *pp_Var6;
  CP_PeerConnection *pCVar7;
  CP_Info p_Var8;
  long lVar9;
  long lVar10;
  CMConnection *pp_Var11;
  _SstStream StackStream;
  _SstStream _Stack_338;
  
  CP_verbose(Stream,PerStepVerbose,"Destroying stream %p, name %s\n",Stream,Stream->Filename);
  __mutex = &Stream->DataLock;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  memcpy(&_Stack_338,Stream,0x310);
  Stream->Status = Destroyed;
  __ptr_01 = Stream->Timesteps;
  while (__ptr_01 != (_TimestepMetadataList *)0x0) {
    p_Var1 = __ptr_01->Next;
    free(__ptr_01);
    Stream->Timesteps = p_Var1;
    __ptr_01 = p_Var1;
  }
  while (__ptr = Stream->StepRequestQueue, __ptr != (StepRequest)0x0) {
    Stream->StepRequestQueue = __ptr->Next;
    free(__ptr);
  }
  if (Stream->DP_Stream != (void *)0x0) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    (*(&Stream->DP_Interface->destroyReader)[Stream->Role != ReaderRole])(&Svcs,Stream->DP_Stream);
    Stream->DP_Stream = (void *)0x0;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
  }
  pp_Var6 = Stream->Readers;
  if (pp_Var6 != (WS_ReaderInfo *)0x0) {
    if (0 < Stream->ReaderCount) {
      lVar9 = 0;
      do {
        p_Var4 = Stream->Readers[lVar9];
        pCVar7 = p_Var4->Connections;
        if (pCVar7 != (CP_PeerConnection *)0x0) {
          if (0 < p_Var4->ReaderCohortSize) {
            pp_Var11 = &pCVar7->CMconn;
            lVar10 = 0;
            do {
              if (*pp_Var11 != (CMConnection)0x0) {
                CMConnection_dereference();
                *pp_Var11 = (CMConnection)0x0;
              }
              free_attr_list(((CP_PeerConnection *)(pp_Var11 + -2))->ContactList);
              lVar10 = lVar10 + 1;
              pp_Var11 = pp_Var11 + 3;
            } while (lVar10 < Stream->Readers[lVar9]->ReaderCohortSize);
            pCVar7 = Stream->Readers[lVar9]->Connections;
          }
          free(pCVar7);
          pp_Var6 = Stream->Readers;
          pp_Var6[lVar9]->Connections = (CP_PeerConnection *)0x0;
          p_Var4 = pp_Var6[lVar9];
        }
        if (p_Var4->Peers != (int *)0x0) {
          free(p_Var4->Peers);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < Stream->ReaderCount);
      pp_Var6 = Stream->Readers;
    }
    Stream->ReaderCount = 0;
    free(pp_Var6);
    Stream->Readers = (WS_ReaderInfo *)0x0;
  }
  __ptr_00 = Stream->PreviousFormats;
  Stream->PreviousFormats = (FFSFormatList)0x0;
  free(Stream->ReleaseList);
  free(Stream->LockDefnsList);
  while (__ptr_00 != (FFSFormatList)0x0) {
    pFVar2 = __ptr_00->Next;
    free(__ptr_00->FormatServerRep);
    free(__ptr_00->FormatIDRep);
    free(__ptr_00);
    __ptr_00 = pFVar2;
  }
  if ((Stream->WriterConfigParams != (_SstParams *)0x0) &&
     (Stream->WriterConfigParams->MarshalMethod == 0)) {
    FFSFreeMarshalData(Stream);
    if (Stream->M != (void *)0x0) {
      free(Stream->M);
    }
    if (Stream->D != (void *)0x0) {
      free(Stream->D);
    }
  }
  if (Stream->Role != ReaderRole) {
    if (Stream->ConfigParams->MarshalMethod == 0) {
      FFSFreeMarshalData(Stream);
    }
    goto LAB_00732d5b;
  }
  if (Stream->ReaderFFSContext != (FFSContext)0x0) {
    free_FFSContext();
    Stream->ReaderFFSContext = (FFSContext)0x0;
  }
  pCVar7 = Stream->ConnectionsToWriter;
  if (Stream->WriterCohortSize < 1) {
    if (pCVar7 != (CP_PeerConnection *)0x0) goto LAB_00732d2e;
  }
  else {
    lVar10 = 0;
    lVar9 = 0;
    do {
      free_attr_list(*(undefined8 *)((long)&pCVar7->ContactList + lVar10));
      pCVar7 = Stream->ConnectionsToWriter;
      lVar3 = *(long *)((long)&pCVar7->CMconn + lVar10);
      if (lVar3 != 0) {
        CMConnection_dereference(lVar3);
        pCVar7 = Stream->ConnectionsToWriter;
        *(undefined8 *)((long)&pCVar7->CMconn + lVar10) = 0;
      }
      lVar9 = lVar9 + 1;
      lVar10 = lVar10 + 0x18;
    } while (lVar9 < Stream->WriterCohortSize);
LAB_00732d2e:
    free(pCVar7);
    Stream->ConnectionsToWriter = (CP_PeerConnection *)0x0;
  }
  free(Stream->Peers);
  if (Stream->RanksRead != (char *)0x0) {
    free(Stream->RanksRead);
  }
LAB_00732d5b:
  p_Var5 = Stream->ConfigParams;
  if (p_Var5->DataTransport != (char *)0x0) {
    free(p_Var5->DataTransport);
    p_Var5 = Stream->ConfigParams;
  }
  if (p_Var5->WANDataTransport != (char *)0x0) {
    free(p_Var5->WANDataTransport);
    p_Var5 = Stream->ConfigParams;
  }
  if (p_Var5->ControlTransport != (char *)0x0) {
    free(p_Var5->ControlTransport);
    p_Var5 = Stream->ConfigParams;
  }
  if (p_Var5->NetworkInterface != (char *)0x0) {
    free(p_Var5->NetworkInterface);
    p_Var5 = Stream->ConfigParams;
  }
  if (p_Var5->ControlInterface != (char *)0x0) {
    free(p_Var5->ControlInterface);
    p_Var5 = Stream->ConfigParams;
  }
  if (p_Var5->DataInterface != (char *)0x0) {
    free(p_Var5->DataInterface);
    p_Var5 = Stream->ConfigParams;
  }
  if (p_Var5->ControlModule != (char *)0x0) {
    free(p_Var5->ControlModule);
  }
  if (Stream->Filename != (char *)0x0) {
    free(Stream->Filename);
    Stream->Filename = (char *)0x0;
  }
  if (Stream->AbsoluteFilename != (char *)0x0) {
    free(Stream->AbsoluteFilename);
    Stream->AbsoluteFilename = (char *)0x0;
  }
  if (Stream->ParamsBlock != (void *)0x0) {
    free(Stream->ParamsBlock);
    Stream->ParamsBlock = (void *)0x0;
  }
  p_Var8 = Stream->CPInfo;
  if (p_Var8->ffs_c != (FFSContext)0x0) {
    free_FFSContext(p_Var8->ffs_c);
    p_Var8 = Stream->CPInfo;
  }
  if (p_Var8->fm_c != (FMContext)0x0) {
    free_FMcontext(p_Var8->fm_c);
    p_Var8 = Stream->CPInfo;
  }
  FreeCustomStructs(&p_Var8->CustomStructs);
  free(Stream->CPInfo);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  pthread_mutex_lock((pthread_mutex_t *)&StateMutex);
  SharedCMInfoRefCount = SharedCMInfoRefCount + -1;
  if (SharedCMInfoRefCount == 0) {
    CP_verbose(Stream,PerStepVerbose,"Reference count now zero, Destroying process SST info cache\n"
              );
    CManager_close(SharedCMInfo->cm);
    FreeCustomStructs(&SharedCMInfo->CustomStructs);
    CP_verbose(Stream,PerStepVerbose,"Freeing LastCallList\n");
    __ptr_02 = SharedCMInfo;
    if (0 < SharedCMInfo->LastCallFreeCount) {
      lVar9 = 0;
      do {
        free(__ptr_02->LastCallFreeList[lVar9]);
        lVar9 = lVar9 + 1;
      } while (lVar9 < __ptr_02->LastCallFreeCount);
    }
    free(__ptr_02->LastCallFreeList);
    free(__ptr_02);
    SharedCMInfo = (CP_GlobalCMInfo)0x0;
    if (CP_SstParamsList != (FMField *)0x0) {
      free_FMfield_list();
    }
    CP_SstParamsList = (FMField *)0x0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&StateMutex);
  CP_verbose(&_Stack_338,PerStepVerbose,"SstStreamDestroy successful, returning\n");
  return;
}

Assistant:

extern void SstStreamDestroy(SstStream Stream)
{
    /*
     * StackStream is only used to access verbosity info
     * in a safe way after all streams have been destroyed
     */
    struct _SstStream StackStream;
    CP_verbose(Stream, PerStepVerbose, "Destroying stream %p, name %s\n", Stream, Stream->Filename);
    STREAM_MUTEX_LOCK(Stream);
    StackStream = *Stream;
    Stream->Status = Destroyed;
    struct _TimestepMetadataList *Next = Stream->Timesteps;
    while (Next)
    {
        Next = Next->Next;
        free(Stream->Timesteps);
        Stream->Timesteps = Next;
    }

    while (Stream->StepRequestQueue)
    {
        StepRequest Request = Stream->StepRequestQueue;
        Stream->StepRequestQueue = Request->Next;
        free(Request);
    }
    if (Stream->DP_Stream)
    {
        STREAM_MUTEX_UNLOCK(Stream);
        if (Stream->Role == ReaderRole)
        {
            Stream->DP_Interface->destroyReader(&Svcs, Stream->DP_Stream);
        }
        else
        {
            Stream->DP_Interface->destroyWriter(&Svcs, Stream->DP_Stream);
        }
        Stream->DP_Stream = NULL;
        STREAM_MUTEX_LOCK(Stream);
    }

    if (Stream->Readers)
    {
        for (int i = 0; i < Stream->ReaderCount; i++)
        {
            CP_PeerConnection *connections_to_reader = Stream->Readers[i]->Connections;

            if (connections_to_reader)
            {
                for (int j = 0; j < Stream->Readers[i]->ReaderCohortSize; j++)
                {
                    if (connections_to_reader[j].CMconn)
                    {
                        CMConnection_dereference(connections_to_reader[j].CMconn);
                        connections_to_reader[j].CMconn = NULL;
                    }
                    free_attr_list(connections_to_reader[j].ContactList);
                }
                free(Stream->Readers[i]->Connections);
                Stream->Readers[i]->Connections = NULL;
            }
            if (Stream->Readers[i]->Peers)
            {
                free(Stream->Readers[i]->Peers);
            }
            // Stream->Readers[i] is free'd in LastCall
        }
        Stream->ReaderCount = 0;
        free(Stream->Readers);
        Stream->Readers = NULL;
    }

    FFSFormatList FFSList = Stream->PreviousFormats;
    Stream->PreviousFormats = NULL;
    free(Stream->ReleaseList);
    free(Stream->LockDefnsList);
    while (FFSList)
    {
        FFSFormatList Tmp = FFSList->Next;
        /* Server rep and ID here are copied */
        free(FFSList->FormatServerRep);
        free(FFSList->FormatIDRep);
        free(FFSList);
        FFSList = Tmp;
    }
    if (Stream->WriterConfigParams && (Stream->WriterConfigParams->MarshalMethod == SstMarshalFFS))
    {
        FFSFreeMarshalData(Stream);
        if (Stream->M)
            free(Stream->M);
        if (Stream->D)
            free(Stream->D);
    }

    if (Stream->Role == ReaderRole)
    {
        /* reader side */
        if (Stream->ReaderFFSContext)
        {
            free_FFSContext(Stream->ReaderFFSContext);
            Stream->ReaderFFSContext = NULL;
        }
        for (int i = 0; i < Stream->WriterCohortSize; i++)
        {
            free_attr_list(Stream->ConnectionsToWriter[i].ContactList);
            if (Stream->ConnectionsToWriter[i].CMconn)
            {
                CMConnection_dereference(Stream->ConnectionsToWriter[i].CMconn);
                Stream->ConnectionsToWriter[i].CMconn = NULL;
            }
        }
        if (Stream->ConnectionsToWriter)
        {
            free(Stream->ConnectionsToWriter);
            Stream->ConnectionsToWriter = NULL;
        }
        free(Stream->Peers);
        if (Stream->RanksRead)
            free(Stream->RanksRead);
    }
    else if (Stream->ConfigParams->MarshalMethod == SstMarshalFFS)
    {
        FFSFreeMarshalData(Stream);
    }
    if (Stream->ConfigParams->DataTransport)
        free(Stream->ConfigParams->DataTransport);
    if (Stream->ConfigParams->WANDataTransport)
        free(Stream->ConfigParams->WANDataTransport);
    if (Stream->ConfigParams->ControlTransport)
        free(Stream->ConfigParams->ControlTransport);
    if (Stream->ConfigParams->NetworkInterface)
        free(Stream->ConfigParams->NetworkInterface);
    if (Stream->ConfigParams->ControlInterface)
        free(Stream->ConfigParams->ControlInterface);
    if (Stream->ConfigParams->DataInterface)
        free(Stream->ConfigParams->DataInterface);
    if (Stream->ConfigParams->ControlModule)
        free(Stream->ConfigParams->ControlModule);

    if (Stream->Filename)
    {
        free(Stream->Filename);
        Stream->Filename = NULL;
    }
    if (Stream->AbsoluteFilename)
    {
        free(Stream->AbsoluteFilename);
        Stream->AbsoluteFilename = NULL;
    }

    if (Stream->ParamsBlock)
    {
        free(Stream->ParamsBlock);
        Stream->ParamsBlock = NULL;
    }
    if (Stream->CPInfo->ffs_c)
        free_FFSContext(Stream->CPInfo->ffs_c);
    if (Stream->CPInfo->fm_c)
        free_FMcontext(Stream->CPInfo->fm_c);
    FreeCustomStructs(&Stream->CPInfo->CustomStructs);
    free(Stream->CPInfo);

    STREAM_MUTEX_UNLOCK(Stream);
    //   Stream is free'd in LastCall

    pthread_mutex_lock(&StateMutex);
    SharedCMInfoRefCount--;
    if (SharedCMInfoRefCount == 0)
    {
        CP_verbose(Stream, PerStepVerbose,
                   "Reference count now zero, Destroying process SST info cache\n");
        CManager_close(SharedCMInfo->cm);
        FreeCustomStructs(&SharedCMInfo->CustomStructs);
        CP_verbose(Stream, PerStepVerbose, "Freeing LastCallList\n");
        for (int i = 0; i < SharedCMInfo->LastCallFreeCount; i++)
        {
            free(SharedCMInfo->LastCallFreeList[i]);
        }
        free(SharedCMInfo->LastCallFreeList);
        free(SharedCMInfo);
        SharedCMInfo = NULL;
        if (CP_SstParamsList)
            free_FMfield_list(CP_SstParamsList);
        CP_SstParamsList = NULL;
    }
    pthread_mutex_unlock(&StateMutex);
    CP_verbose(&StackStream, PerStepVerbose, "SstStreamDestroy successful, returning\n");
}